

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlTextReaderPtr xmlNewTextReaderFilename(char *URI)

{
  xmlParserInputBufferPtr input_00;
  xmlTextReaderPtr ret;
  xmlParserInputBufferPtr input;
  char *URI_local;
  
  input_00 = xmlParserInputBufferCreateFilename(URI,XML_CHAR_ENCODING_NONE);
  if (input_00 == (xmlParserInputBufferPtr)0x0) {
    URI_local = (char *)0x0;
  }
  else {
    URI_local = (char *)xmlNewTextReader(input_00,URI);
    if ((xmlTextReaderPtr)URI_local == (xmlTextReaderPtr)0x0) {
      xmlFreeParserInputBuffer(input_00);
      URI_local = (char *)0x0;
    }
    else {
      ((xmlTextReaderPtr)URI_local)->allocs = ((xmlTextReaderPtr)URI_local)->allocs | 1;
    }
  }
  return (xmlTextReaderPtr)URI_local;
}

Assistant:

xmlTextReaderPtr
xmlNewTextReaderFilename(const char *URI) {
    xmlParserInputBufferPtr input;
    xmlTextReaderPtr ret;

    input = xmlParserInputBufferCreateFilename(URI, XML_CHAR_ENCODING_NONE);
    if (input == NULL)
	return(NULL);
    ret = xmlNewTextReader(input, URI);
    if (ret == NULL) {
	xmlFreeParserInputBuffer(input);
	return(NULL);
    }
    ret->allocs |= XML_TEXTREADER_INPUT;
    return(ret);
}